

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QControlledGate2.cpp
# Opt level: O1

void __thiscall
qclab::qgates::QControlledGate2<std::complex<double>_>::apply
          (QControlledGate2<std::complex<double>_> *this,Side side,Op op,int nbQubits,
          SquareMatrix<std::complex<double>_> *matrix,int offset)

{
  undefined8 *puVar1;
  complex<double> *pcVar2;
  complex<double> *pcVar3;
  SquareMatrix<std::complex<double>_> *pSVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  undefined4 extraout_var;
  double dVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  undefined7 in_register_00000031;
  char *__assertion;
  double dVar13;
  QControlledGate2<std::complex<double>_> *pQVar14;
  double dVar15;
  matrix_type mat1;
  complex<double> x2;
  complex<double> x1;
  vector<int,_std::allocator<int>_> qubits;
  double local_118;
  double dStack_110;
  double local_108;
  long local_100;
  double local_f8;
  double local_f0;
  SquareMatrix<std::complex<double>_> local_e8;
  double local_d8;
  double local_d0;
  long local_c8;
  long local_c0;
  long local_b8;
  long local_b0;
  double local_a8;
  double local_a0;
  SquareMatrix<std::complex<double>_> *local_98;
  double local_90;
  complex<double> local_88;
  QControlledGate2<std::complex<double>_> *local_78;
  int local_6c;
  complex<double> local_68;
  long local_50;
  int *local_48 [2];
  long local_38;
  
  if (nbQubits < 2) {
    __assert_fail("nbQubits >= 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/src/qgates/QControlledGate2.cpp"
                  ,0x2e,
                  "virtual void qclab::qgates::QControlledGate2<std::complex<double>>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = std::complex<double>]"
                 );
  }
  local_108 = (double)CONCAT44(local_108._4_4_,(int)CONCAT71(in_register_00000031,side));
  if (matrix->size_ != (long)(1 << ((byte)nbQubits & 0x1f))) {
    __assert_fail("matrix.size() == 1 << nbQubits",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/src/qgates/QControlledGate2.cpp"
                  ,0x2f,
                  "virtual void qclab::qgates::QControlledGate2<std::complex<double>>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = std::complex<double>]"
                 );
  }
  (*(this->super_QGate2<std::complex<double>_>).super_QObject<std::complex<double>_>._vptr_QObject
    [5])(local_48,this);
  iVar5 = *local_48[0];
  *local_48[0] = iVar5 + offset;
  iVar6 = local_48[0][1];
  local_48[0][1] = offset + iVar6;
  if (iVar5 + offset < nbQubits) {
    if (offset + iVar6 < nbQubits) {
      iVar5 = (*(this->super_QGate2<std::complex<double>_>).super_QObject<std::complex<double>_>.
                _vptr_QObject[0x10])(this);
      (**(code **)(*(long *)CONCAT44(extraout_var,iVar5) + 0x38))
                (&local_e8,(long *)CONCAT44(extraout_var,iVar5));
      dense::operateInPlace<qclab::dense::SquareMatrix<std::complex<double>>>(op,&local_e8);
      iVar5 = this->control_;
      iVar6 = (*(this->super_QGate2<std::complex<double>_>).super_QObject<std::complex<double>_>.
                _vptr_QObject[0xf])(this);
      local_98 = matrix;
      local_78 = this;
      if (iVar5 < iVar6) {
        iVar6 = (*(this->super_QGate2<std::complex<double>_>).super_QObject<std::complex<double>_>.
                  _vptr_QObject[0xf])(this);
        iVar5 = this->control_;
        iVar7 = (*(this->super_QGate2<std::complex<double>_>).super_QObject<std::complex<double>_>.
                  _vptr_QObject[0xf])(this);
        uVar8 = (*(this->super_QGate2<std::complex<double>_>).super_QObject<std::complex<double>_>.
                  _vptr_QObject[0xf])(this);
        pSVar4 = local_98;
        local_90 = (double)CONCAT44(local_90._4_4_,iVar7);
        local_100 = (long)(1 << ((char)iVar6 - (char)iVar5 & 0x1fU));
        local_b0 = CONCAT44(local_b0._4_4_,~uVar8 + nbQubits);
        dVar9 = (double)(long)(1 << ((byte)iVar7 & 0x1f));
        dVar13 = (double)(long)(1 << ((byte)(~uVar8 + nbQubits) & 0x1f));
        if (local_108._0_1_ == 'L') {
          if (0 < matrix->size_) {
            local_c8 = (long)dVar13 * 2;
            local_b8 = local_100 / 2;
            local_a8 = 4.94065645841247e-324;
            if (1 < (long)dVar13) {
              local_a8 = dVar13;
            }
            local_a0 = 4.94065645841247e-324;
            if (1 < (long)dVar9) {
              local_a0 = dVar9;
            }
            local_c0 = 0;
            local_d0 = dVar13;
            do {
              lVar12 = local_c0;
              if (local_90._0_4_ != 0x1f) {
                local_d8 = 0.0;
                local_108 = 0.0;
                do {
                  if (local_78->controlState_ == 1) {
                    if (local_b8 <= (long)local_108 % local_100) goto LAB_00112f04;
                  }
                  else if ((local_78->controlState_ != 0) ||
                          ((long)local_108 % local_100 < local_b8)) {
LAB_00112f04:
                    dVar9 = local_a8;
                    dVar15 = local_d8;
                    if ((int)local_b0 != 0x1f) {
                      do {
                        pcVar2 = (pSVar4->data_)._M_t.
                                 super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                 .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
                        pcVar3 = pcVar2 + pSVar4->size_ * (long)dVar15 + lVar12;
                        local_68._M_value._0_8_ = *(undefined8 *)pcVar3->_M_value;
                        local_68._M_value._8_8_ = *(undefined8 *)(pcVar3->_M_value + 8);
                        pcVar2 = pcVar2 + pSVar4->size_ * ((long)dVar13 + (long)dVar15) + lVar12;
                        local_88._M_value._0_8_ = *(undefined8 *)pcVar2->_M_value;
                        local_88._M_value._8_8_ = *(undefined8 *)(pcVar2->_M_value + 8);
                        local_118 = *(double *)
                                     local_e8.data_._M_t.
                                     super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                     .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                     _M_head_impl;
                        dStack_110 = *(double *)
                                      ((long)local_e8.data_._M_t.
                                             super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                             .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                             _M_head_impl + 8);
                        std::complex<double>::operator*=((complex<double> *)&local_118,&local_68);
                        local_f8 = local_118;
                        local_f0 = dStack_110;
                        local_118 = *(double *)
                                     ((complex<double> *)
                                     ((long)local_e8.data_._M_t.
                                            super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                            .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                            _M_head_impl + 0x10))->_M_value;
                        dStack_110 = *(double *)
                                      ((long)local_e8.data_._M_t.
                                             super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                             .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                             _M_head_impl + 0x18);
                        std::complex<double>::operator*=((complex<double> *)&local_118,&local_88);
                        lVar10 = pSVar4->size_ * (long)dVar15;
                        pcVar3 = (pSVar4->data_)._M_t.
                                 super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                 .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
                        *(double *)pcVar3[lVar10 + lVar12]._M_value = local_f8 + local_118;
                        *(double *)(pcVar3[lVar10 + lVar12]._M_value + 8) = local_f0 + dStack_110;
                        local_118 = *(double *)
                                     ((complex<double> *)
                                     ((long)local_e8.data_._M_t.
                                            super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                            .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                            _M_head_impl + local_e8.size_ * 0x10))->_M_value;
                        dStack_110 = *(double *)
                                      ((long)((complex<double> *)
                                             ((long)local_e8.data_._M_t.
                                                                                                        
                                                  super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                                  .
                                                  super__Head_base<0UL,_std::complex<double>_*,_false>
                                                  ._M_head_impl + local_e8.size_ * 0x10))->_M_value
                                      + 8);
                        std::complex<double>::operator*=((complex<double> *)&local_118,&local_68);
                        local_f0 = local_118;
                        local_f8 = dStack_110;
                        local_118 = *(double *)
                                     ((complex<double> *)
                                     ((long)local_e8.data_._M_t.
                                            super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                            .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                            _M_head_impl + 0x10))[local_e8.size_]._M_value;
                        dStack_110 = *(double *)
                                      ((long)((complex<double> *)
                                             ((long)local_e8.data_._M_t.
                                                                                                        
                                                  super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                                  .
                                                  super__Head_base<0UL,_std::complex<double>_*,_false>
                                                  ._M_head_impl + 0x10))[local_e8.size_]._M_value +
                                      8);
                        std::complex<double>::operator*=((complex<double> *)&local_118,&local_88);
                        lVar10 = ((long)dVar13 + (long)dVar15) * pSVar4->size_;
                        pcVar3 = (pSVar4->data_)._M_t.
                                 super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                 .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
                        *(double *)pcVar3[lVar10 + lVar12]._M_value = local_f0 + local_118;
                        *(double *)(pcVar3[lVar10 + lVar12]._M_value + 8) = local_f8 + dStack_110;
                        dVar9 = (double)((long)dVar9 + -1);
                        dVar13 = local_d0;
                        dVar15 = (double)((long)dVar15 + 1);
                      } while (dVar9 != 0.0);
                    }
                  }
                  local_108 = (double)((long)local_108 + 1);
                  local_d8 = (double)((long)local_d8 + local_c8);
                } while (local_108 != local_a0);
              }
              local_c0 = local_c0 + 1;
            } while (local_c0 < local_98->size_);
          }
        }
        else if (0 < matrix->size_) {
          local_b8 = local_100 / 2;
          local_a8 = 4.94065645841247e-324;
          if (1 < (long)dVar13) {
            local_a8 = dVar13;
          }
          local_a0 = 4.94065645841247e-324;
          if (1 < (long)dVar9) {
            local_a0 = dVar9;
          }
          dVar9 = (double)((long)dVar13 << 4);
          local_d0 = (double)((long)dVar13 << 5);
          lVar10 = 0;
          lVar12 = 0;
          local_108 = dVar9;
          do {
            local_c0 = lVar12;
            if (local_90._0_4_ != 0x1f) {
              local_c8 = 0;
              local_d8 = 0.0;
              do {
                if (local_78->controlState_ == 1) {
                  if (local_b8 <= (long)local_d8 % local_100) goto LAB_00113771;
                }
                else if ((local_78->controlState_ != 0) || ((long)local_d8 % local_100 < local_b8))
                {
LAB_00113771:
                  dVar13 = local_a8;
                  lVar12 = local_c8;
                  if ((int)local_b0 != 0x1f) {
                    do {
                      lVar11 = pSVar4->size_ * lVar10;
                      pcVar3 = (pSVar4->data_)._M_t.
                               super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                               .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
                      puVar1 = (undefined8 *)(pcVar3->_M_value + lVar12 + lVar11);
                      local_68._M_value._0_8_ = *puVar1;
                      local_68._M_value._8_8_ = puVar1[1];
                      puVar1 = (undefined8 *)(pcVar3->_M_value + (long)dVar9 + lVar12 + lVar11);
                      local_88._M_value._0_8_ = *puVar1;
                      local_88._M_value._8_8_ = puVar1[1];
                      local_118 = *(double *)
                                   local_e8.data_._M_t.
                                   super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                   .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                   _M_head_impl;
                      dStack_110 = *(double *)
                                    ((long)local_e8.data_._M_t.
                                           super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                           .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                           _M_head_impl + 8);
                      std::complex<double>::operator*=((complex<double> *)&local_118,&local_68);
                      local_f8 = local_118;
                      local_f0 = dStack_110;
                      pcVar3 = (complex<double> *)
                               ((long)local_e8.data_._M_t.
                                      super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                      .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                      _M_head_impl + local_e8.size_ * 0x10);
                      local_118 = *(double *)pcVar3->_M_value;
                      dStack_110 = *(double *)((long)pcVar3->_M_value + 8);
                      std::complex<double>::operator*=((complex<double> *)&local_118,&local_88);
                      lVar11 = pSVar4->size_ * lVar10;
                      pcVar3 = (pSVar4->data_)._M_t.
                               super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                               .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
                      *(double *)(pcVar3->_M_value + lVar12 + lVar11) = local_f8 + local_118;
                      *(double *)(pcVar3->_M_value + lVar12 + 8 + lVar11) = local_f0 + dStack_110;
                      local_118 = *(double *)
                                   ((complex<double> *)
                                   ((long)local_e8.data_._M_t.
                                          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                          .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                          _M_head_impl + 0x10))->_M_value;
                      dStack_110 = *(double *)
                                    ((long)((complex<double> *)
                                           ((long)local_e8.data_._M_t.
                                                  super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                                  .
                                                  super__Head_base<0UL,_std::complex<double>_*,_false>
                                                  ._M_head_impl + 0x10))->_M_value + 8);
                      std::complex<double>::operator*=((complex<double> *)&local_118,&local_68);
                      local_f8 = local_118;
                      local_f0 = dStack_110;
                      local_118 = *(double *)
                                   ((complex<double> *)
                                   ((long)local_e8.data_._M_t.
                                          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                          .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                          _M_head_impl + 0x10))[local_e8.size_]._M_value;
                      dStack_110 = *(double *)
                                    ((long)((complex<double> *)
                                           ((long)local_e8.data_._M_t.
                                                  super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                                  .
                                                  super__Head_base<0UL,_std::complex<double>_*,_false>
                                                  ._M_head_impl + 0x10))[local_e8.size_]._M_value +
                                    8);
                      std::complex<double>::operator*=((complex<double> *)&local_118,&local_88);
                      pcVar3 = (pSVar4->data_)._M_t.
                               super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                               .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
                      lVar11 = (long)local_108 + pSVar4->size_ * lVar10;
                      *(double *)(pcVar3->_M_value + lVar12 + lVar11) = local_f8 + local_118;
                      *(double *)(pcVar3->_M_value + lVar12 + 8 + lVar11) = local_f0 + dStack_110;
                      dVar13 = (double)((long)dVar13 + -1);
                      dVar9 = local_108;
                      lVar12 = lVar12 + 0x10;
                    } while (dVar13 != 0.0);
                  }
                }
                local_d8 = (double)((long)local_d8 + 1);
                local_c8 = local_c8 + (long)local_d0;
              } while (local_d8 != local_a0);
            }
            lVar12 = local_c0 + 1;
            lVar10 = lVar10 + 0x10;
          } while (lVar12 < pSVar4->size_);
        }
      }
      else {
        iVar5 = this->control_;
        iVar6 = (*(this->super_QGate2<std::complex<double>_>).super_QObject<std::complex<double>_>.
                  _vptr_QObject[0xf])(this);
        uVar8 = (*(this->super_QGate2<std::complex<double>_>).super_QObject<std::complex<double>_>.
                  _vptr_QObject[0xf])(this);
        pSVar4 = local_98;
        local_f0 = (double)(long)(1 << ((byte)nbQubits - (char)iVar5 & 0x1f));
        local_b8 = CONCAT44(local_b8._4_4_,~uVar8 + nbQubits);
        dVar13 = (double)(long)(1 << ((byte)iVar6 & 0x1f));
        local_f8 = (double)(long)(1 << ((byte)(~uVar8 + nbQubits) & 0x1f));
        local_6c = iVar6;
        if (local_108._0_1_ == 'L') {
          if (0 < matrix->size_) {
            local_c0 = (long)local_f8 * 2;
            local_c8 = (long)local_f0 / 2;
            local_d8 = 4.94065645841247e-324;
            if (1 < (long)local_f8) {
              local_d8 = local_f8;
            }
            local_90 = 4.94065645841247e-324;
            if (1 < (long)dVar13) {
              local_90 = dVar13;
            }
            local_50 = 0;
            do {
              if (local_6c != 0x1f) {
                local_a0 = (double)(local_50 << 4);
                local_100 = 0;
                dVar13 = 0.0;
                pQVar14 = local_78;
                do {
                  local_a8 = dVar13;
                  if ((int)local_b8 != 0x1f) {
                    local_b0 = (long)local_f8 + local_100;
                    dVar13 = 0.0;
                    do {
                      dVar9 = local_a0;
                      if (pQVar14->controlState_ == 1) {
                        if (local_c8 <= (long)dVar13 % (long)local_f0) goto LAB_00113231;
                      }
                      else if ((pQVar14->controlState_ != 0) ||
                              ((long)dVar13 % (long)local_f0 < local_c8)) {
LAB_00113231:
                        lVar12 = local_100 + (long)dVar13;
                        lVar10 = local_b0 + (long)dVar13;
                        pcVar3 = (local_98->data_)._M_t.
                                 super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                 .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
                        puVar1 = (undefined8 *)
                                 (pcVar3[local_98->size_ * lVar12]._M_value + (long)local_a0);
                        local_68._M_value._0_8_ = *puVar1;
                        local_68._M_value._8_8_ = puVar1[1];
                        puVar1 = (undefined8 *)
                                 (pcVar3[local_98->size_ * lVar10]._M_value + (long)local_a0);
                        local_88._M_value._0_8_ = *puVar1;
                        local_88._M_value._8_8_ = puVar1[1];
                        local_118 = *(double *)
                                     local_e8.data_._M_t.
                                     super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                     .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                     _M_head_impl;
                        dStack_110 = *(double *)
                                      ((long)local_e8.data_._M_t.
                                             super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                             .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                             _M_head_impl + 8);
                        std::complex<double>::operator*=((complex<double> *)&local_118,&local_68);
                        local_108 = local_118;
                        local_d0 = dStack_110;
                        local_118 = *(double *)
                                     ((complex<double> *)
                                     ((long)local_e8.data_._M_t.
                                            super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                            .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                            _M_head_impl + 0x10))->_M_value;
                        dStack_110 = *(double *)
                                      ((long)local_e8.data_._M_t.
                                             super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                             .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                             _M_head_impl + 0x18);
                        std::complex<double>::operator*=((complex<double> *)&local_118,&local_88);
                        pQVar14 = local_78;
                        lVar12 = lVar12 * pSVar4->size_;
                        pcVar3 = (pSVar4->data_)._M_t.
                                 super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                 .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
                        *(double *)(pcVar3[lVar12]._M_value + (long)dVar9) = local_108 + local_118;
                        *(double *)(pcVar3[lVar12]._M_value + (long)dVar9 + 8) =
                             local_d0 + dStack_110;
                        pcVar3 = (complex<double> *)
                                 ((long)local_e8.data_._M_t.
                                        super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                        .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                        _M_head_impl + local_e8.size_ * 0x10);
                        local_118 = *(double *)pcVar3->_M_value;
                        dStack_110 = *(double *)((long)pcVar3->_M_value + 8);
                        std::complex<double>::operator*=((complex<double> *)&local_118,&local_68);
                        local_108 = local_118;
                        local_d0 = dStack_110;
                        local_118 = *(double *)
                                     ((complex<double> *)
                                     ((long)local_e8.data_._M_t.
                                            super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                            .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                            _M_head_impl + (local_e8.size_ + 1) * 0x10))->_M_value;
                        dStack_110 = *(double *)
                                      ((long)((complex<double> *)
                                             ((long)local_e8.data_._M_t.
                                                                                                        
                                                  super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                                  .
                                                  super__Head_base<0UL,_std::complex<double>_*,_false>
                                                  ._M_head_impl + (local_e8.size_ + 1) * 0x10))->
                                             _M_value + 8);
                        std::complex<double>::operator*=((complex<double> *)&local_118,&local_88);
                        lVar10 = lVar10 * pSVar4->size_;
                        pcVar3 = (pSVar4->data_)._M_t.
                                 super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                 .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
                        *(double *)(pcVar3[lVar10]._M_value + (long)dVar9) = local_108 + local_118;
                        *(double *)(pcVar3[lVar10]._M_value + (long)dVar9 + 8) =
                             local_d0 + dStack_110;
                      }
                      dVar13 = (double)((long)dVar13 + 1);
                    } while (local_d8 != dVar13);
                  }
                  dVar13 = (double)((long)local_a8 + 1);
                  local_100 = local_100 + local_c0;
                } while (dVar13 != local_90);
              }
              local_50 = local_50 + 1;
            } while (local_50 < local_98->size_);
          }
        }
        else if (0 < matrix->size_) {
          local_100 = (long)local_f0 / 2;
          local_d8 = 4.94065645841247e-324;
          if (1 < (long)local_f8) {
            local_d8 = local_f8;
          }
          local_a8 = 4.94065645841247e-324;
          if (1 < (long)dVar13) {
            local_a8 = dVar13;
          }
          local_c0 = (long)local_f8 << 5;
          local_f8 = (double)((long)local_f8 << 4);
          local_c8 = 0;
          dVar13 = 0.0;
          do {
            local_90 = dVar13;
            if (local_6c != 0x1f) {
              local_b0 = 0;
              dVar13 = 0.0;
              do {
                local_a0 = dVar13;
                if ((int)local_b8 != 0x1f) {
                  dVar13 = 0.0;
                  lVar12 = local_b0;
                  do {
                    lVar10 = local_c8;
                    if (local_78->controlState_ == 1) {
                      if (local_100 <= (long)dVar13 % (long)local_f0) goto LAB_001134f8;
                    }
                    else if ((local_78->controlState_ != 0) ||
                            ((long)dVar13 % (long)local_f0 < local_100)) {
LAB_001134f8:
                      lVar11 = pSVar4->size_ * local_c8;
                      pcVar3 = (pSVar4->data_)._M_t.
                               super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                               .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
                      puVar1 = (undefined8 *)(pcVar3->_M_value + lVar12 + lVar11);
                      local_68._M_value._0_8_ = *puVar1;
                      local_68._M_value._8_8_ = puVar1[1];
                      puVar1 = (undefined8 *)(pcVar3->_M_value + (long)local_f8 + lVar12 + lVar11);
                      local_88._M_value._0_8_ = *puVar1;
                      local_88._M_value._8_8_ = puVar1[1];
                      local_118 = *(double *)
                                   local_e8.data_._M_t.
                                   super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                   .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                   _M_head_impl;
                      dStack_110 = *(double *)
                                    ((long)local_e8.data_._M_t.
                                           super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                           .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                           _M_head_impl + 8);
                      std::complex<double>::operator*=((complex<double> *)&local_118,&local_68);
                      local_108 = local_118;
                      local_d0 = dStack_110;
                      pcVar3 = (complex<double> *)
                               ((long)local_e8.data_._M_t.
                                      super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                      .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                      _M_head_impl + local_e8.size_ * 0x10);
                      local_118 = *(double *)pcVar3->_M_value;
                      dStack_110 = *(double *)((long)pcVar3->_M_value + 8);
                      std::complex<double>::operator*=((complex<double> *)&local_118,&local_88);
                      lVar11 = pSVar4->size_ * lVar10;
                      pcVar3 = (pSVar4->data_)._M_t.
                               super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                               .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
                      *(double *)(pcVar3->_M_value + lVar12 + lVar11) = local_108 + local_118;
                      *(double *)(pcVar3->_M_value + lVar12 + 8 + lVar11) = local_d0 + dStack_110;
                      local_118 = *(double *)
                                   ((complex<double> *)
                                   ((long)local_e8.data_._M_t.
                                          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                          .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                          _M_head_impl + 0x10))->_M_value;
                      dStack_110 = *(double *)
                                    ((long)local_e8.data_._M_t.
                                           super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                           .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                           _M_head_impl + 0x18);
                      std::complex<double>::operator*=((complex<double> *)&local_118,&local_68);
                      local_108 = local_118;
                      local_d0 = dStack_110;
                      local_118 = *(double *)
                                   ((complex<double> *)
                                   ((long)local_e8.data_._M_t.
                                          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                          .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                          _M_head_impl + (local_e8.size_ + 1) * 0x10))->_M_value;
                      dStack_110 = *(double *)
                                    ((long)((complex<double> *)
                                           ((long)local_e8.data_._M_t.
                                                  super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                                  .
                                                  super__Head_base<0UL,_std::complex<double>_*,_false>
                                                  ._M_head_impl + (local_e8.size_ + 1) * 0x10))->
                                           _M_value + 8);
                      std::complex<double>::operator*=((complex<double> *)&local_118,&local_88);
                      pcVar3 = (pSVar4->data_)._M_t.
                               super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                               .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
                      lVar10 = (long)local_f8 + pSVar4->size_ * lVar10;
                      *(double *)(pcVar3->_M_value + lVar12 + lVar10) = local_108 + local_118;
                      *(double *)(pcVar3->_M_value + lVar12 + 8 + lVar10) = local_d0 + dStack_110;
                    }
                    dVar13 = (double)((long)dVar13 + 1);
                    lVar12 = lVar12 + 0x10;
                  } while (local_d8 != dVar13);
                }
                dVar13 = (double)((long)local_a0 + 1);
                local_b0 = local_b0 + local_c0;
              } while (dVar13 != local_a8);
            }
            dVar13 = (double)((long)local_90 + 1);
            local_c8 = local_c8 + 0x10;
          } while ((long)dVar13 < pSVar4->size_);
        }
      }
      if ((_Head_base<0UL,_std::complex<double>_*,_false>)
          local_e8.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl !=
          (_Head_base<0UL,_std::complex<double>_*,_false>)0x0) {
        operator_delete__((void *)local_e8.data_._M_t.
                                  super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                  .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl
                         );
      }
      if (local_48[0] != (int *)0x0) {
        operator_delete(local_48[0],local_38 - (long)local_48[0]);
      }
      return;
    }
    __assertion = "qubits[1] < nbQubits";
  }
  else {
    __assertion = "qubits[0] < nbQubits";
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/src/qgates/QControlledGate2.cpp"
                ,0x33,
                "virtual void qclab::qgates::QControlledGate2<std::complex<double>>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = std::complex<double>]"
               );
}

Assistant:

void QControlledGate2< T >::apply( Side side , Op op , const int nbQubits ,
                                     qclab::dense::SquareMatrix< T >& matrix ,
                                     const int offset ) const {
    using matrix_type = qclab::dense::SquareMatrix< T > ;
    assert( nbQubits >= 2 ) ;
    assert( matrix.size() == 1 << nbQubits ) ;
    auto qubits = this->qubits() ;
    qubits[0] += offset ;
    qubits[1] += offset ;
    assert( qubits[0] < nbQubits ) ; assert( qubits[1] < nbQubits ) ;
    // operation
    matrix_type  mat1 = this->gate()->matrix() ;
    qclab::dense::operateInPlace( op , mat1 ) ;
    // control / target
    if ( control() < target() ) {
      // control() < target()
      const int64_t d = 1 << ( target() - control() ) ;
      const int64_t nLeft  = 1 << target() ;
      const int64_t nRight = 1 << ( nbQubits - target() - 1 ) ;
      if ( side == Side::Left ) {
        #pragma omp parallel for
        for ( int64_t i = 0; i < matrix.rows(); i++ ) {
          for ( int64_t k = 0; k < nLeft; k++ ) {
            if ( controlState_ == 0 && ( k % d >= d/2 ) ) continue ;
            if ( controlState_ == 1 && ( k % d <  d/2 ) ) continue ;
            for ( int64_t j = 0; j < nRight; j++ ) {
              const int64_t j1 = j + 2 * k * nRight ;
              const int64_t j2 = j1 + nRight ;
              const T x1 = matrix(i,j1) ;
              const T x2 = matrix(i,j2) ;
              matrix(i,j1) = mat1(0,0) * x1 + mat1(1,0) * x2 ;
              matrix(i,j2) = mat1(0,1) * x1 + mat1(1,1) * x2 ;
            }
          }
        }
      } else {
        #pragma omp parallel for
        for ( int64_t j = 0; j < matrix.cols(); j++ ) {
          for ( int64_t k = 0; k < nLeft; k++ ) {
            if ( controlState_ == 0 && ( k % d >= d/2 ) ) continue ;
            if ( controlState_ == 1 && ( k % d <  d/2 ) ) continue ;
            for ( int64_t i = 0; i < nRight; i++ ) {
              const int64_t i1 = i + 2 * k * nRight ;
              const int64_t i2 = i1 + nRight ;
              const T x1 = matrix(i1,j) ;
              const T x2 = matrix(i2,j) ;
              matrix(i1,j) = mat1(0,0) * x1 + mat1(0,1) * x2 ;
              matrix(i2,j) = mat1(1,0) * x1 + mat1(1,1) * x2 ;
            }
          }
        }
      }
    } else {
      // control() >= target()
      const int64_t d = 1 << ( nbQubits - control() ) ;
      const int64_t nLeft  = 1 << target() ;
      const int64_t nRight = 1 << ( nbQubits - target() - 1 ) ;
      if ( side == Side::Left ) {
        #pragma omp parallel for
        for ( int64_t i = 0; i < matrix.cols(); i++ ) {
          for ( int64_t k = 0; k < nLeft; k++ ) {
            for ( int64_t j = 0; j < nRight; j++ ) {
              if ( controlState_ == 0 && ( j % d >= d/2 ) ) continue ;
              if ( controlState_ == 1 && ( j % d <  d/2 ) ) continue ;
              const int64_t j1 = j + 2 * k * nRight ;
              const int64_t j2 = j1 + nRight ;
              const T x1 = matrix(i,j1) ;
              const T x2 = matrix(i,j2) ;
              matrix(i,j1) = mat1(0,0) * x1 + mat1(1,0) * x2 ;
              matrix(i,j2) = mat1(0,1) * x1 + mat1(1,1) * x2 ;
            }
          }
        }
      } else {
        #pragma omp parallel for
        for ( int64_t j = 0; j < matrix.cols(); j++ ) {
          for ( int64_t k = 0; k < nLeft; k++ ) {
            for ( int64_t i = 0; i < nRight; i++ ) {
              if ( controlState_ == 0 && ( i % d >= d/2 ) ) continue ;
              if ( controlState_ == 1 && ( i % d <  d/2 ) ) continue ;
              const int64_t i1 = i + 2 * k * nRight ;
              const int64_t i2 = i1 + nRight ;
              const T x1 = matrix(i1,j) ;
              const T x2 = matrix(i2,j) ;
              matrix(i1,j) = mat1(0,0) * x1 + mat1(0,1) * x2 ;
              matrix(i2,j) = mat1(1,0) * x1 + mat1(1,1) * x2 ;
            }
          }
        }
      }
    }
  }